

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

Vec_Int_t * Bac_NtkDfs(Bac_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vBoxes;
  int iVar3;
  int i;
  long lVar4;
  int Counter;
  int iVar5;
  
  iVar3 = (p->vType).nSize;
  iVar5 = 0;
  iVar2 = iVar3;
  for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    uVar1 = Abc_Lit2Var((int)(p->vType).pArray[lVar4]);
    iVar5 = iVar5 + (uint)(uVar1 < 5);
    iVar2 = (p->vType).nSize;
  }
  vBoxes = Vec_IntAlloc(iVar3 - iVar5);
  Bac_NtkStartCopies(p);
  for (iVar3 = 0; iVar3 < (p->vInputs).nSize; iVar3 = iVar3 + 1) {
    iVar2 = Vec_IntEntry(&p->vInputs,iVar3);
    Bac_ObjSetCopy(p,iVar2,1);
  }
  for (iVar3 = 0; iVar3 < (p->vOutputs).nSize; iVar3 = iVar3 + 1) {
    iVar2 = Vec_IntEntry(&p->vOutputs,iVar3);
    iVar2 = Bac_ObjFanin(p,iVar2);
    Bac_NtkDfs_rec(p,iVar2,vBoxes);
  }
  return vBoxes;
}

Assistant:

Vec_Int_t * Bac_NtkDfs( Bac_Ntk_t * p )
{
    int i, iObj;
    Vec_Int_t * vBoxes = Vec_IntAlloc( Bac_NtkBoxNum(p) );
    Bac_NtkStartCopies( p ); // -1 = not visited; 1 = finished
    Bac_NtkForEachPi( p, iObj, i )
        Bac_ObjSetCopy( p, iObj, 1 );
    Bac_NtkForEachPo( p, iObj, i )
        Bac_NtkDfs_rec( p, Bac_ObjFanin(p, iObj), vBoxes );
    return vBoxes;
}